

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<unsigned_long_long>>
               (GetterXsYs<unsigned_long_long> getter,TransformerLogLog transformer,
               ImDrawList *DrawList,ImPlotMarker marker,float size,bool rend_mk_line,
               ImU32 col_mk_line,float weight,bool rend_mk_fill,ImU32 col_mk_fill)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  ImVec2 IVar3;
  undefined8 uVar4;
  ImPlotPlot *pIVar5;
  double dVar6;
  double dVar7;
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  long lVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ImVec2 c;
  ImVec2 local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  pIVar8 = GImPlot;
  if (0 < getter.Count) {
    iVar11 = 0;
    do {
      pIVar9 = GImPlot;
      lVar10 = (long)(((getter.Offset + iVar11) % getter.Count + getter.Count) % getter.Count) *
               (long)getter.Stride;
      uVar1 = *(unsigned_long_long *)((long)getter.Xs + lVar10);
      auVar14._8_4_ = (int)(uVar1 >> 0x20);
      auVar14._0_8_ = uVar1;
      auVar14._12_4_ = 0x45300000;
      uVar2 = *(unsigned_long_long *)((long)getter.Ys + lVar10);
      auVar15._8_4_ = (int)(uVar2 >> 0x20);
      auVar15._0_8_ = uVar2;
      auVar15._12_4_ = 0x45300000;
      dVar6 = log10(((auVar14._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                    (GImPlot->CurrentPlot->XAxis).Range.Min);
      pIVar5 = pIVar9->CurrentPlot;
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._0_8_ = dVar6;
      local_68._12_4_ = extraout_XMM0_Dd;
      local_58 = pIVar9->LogDenX;
      uStack_50 = 0;
      dVar6 = (pIVar5->XAxis).Range.Min;
      local_48 = (pIVar5->XAxis).Range.Max;
      uStack_40 = 0;
      dVar7 = log10(((auVar15._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                    pIVar5->YAxis[transformer.YAxis].Range.Min);
      pIVar5 = pIVar9->CurrentPlot;
      auVar16._8_8_ = dVar7;
      auVar16._0_8_ = local_68._0_8_;
      auVar17._8_4_ = SUB84(pIVar9->LogDenY[transformer.YAxis],0);
      auVar17._0_8_ = local_58;
      auVar17._12_4_ = (int)((ulong)pIVar9->LogDenY[transformer.YAxis] >> 0x20);
      auVar17 = divpd(auVar16,auVar17);
      dVar7 = pIVar5->YAxis[transformer.YAxis].Range.Min;
      IVar3 = pIVar9->PixelRange[transformer.YAxis].Min;
      fVar12 = (float)(pIVar9->Mx *
                       (((double)(float)auVar17._0_8_ * (local_48 - dVar6) + dVar6) -
                       (pIVar5->XAxis).Range.Min) + (double)IVar3.x);
      fVar13 = (float)(pIVar9->My[transformer.YAxis] *
                       (((double)(float)auVar17._8_8_ *
                         (pIVar5->YAxis[transformer.YAxis].Range.Max - dVar7) + dVar7) - dVar7) +
                      (double)IVar3.y);
      local_70.y = fVar13;
      local_70.x = fVar12;
      pIVar5 = pIVar8->CurrentPlot;
      if (((((pIVar5->PlotRect).Min.x <= fVar12) &&
           (uVar4 = *(undefined8 *)&(pIVar5->PlotRect).Min.y, (float)uVar4 <= fVar13)) &&
          (fVar12 < (float)((ulong)uVar4 >> 0x20))) && (fVar13 < (pIVar5->PlotRect).Max.y)) {
        (*RenderMarkers<ImPlot::TransformerLogLog,_ImPlot::GetterXsYs<unsigned_long_long>_>::
          marker_table[marker])
                  (DrawList,&local_70,size,rend_mk_line,col_mk_line,rend_mk_fill,col_mk_fill,weight)
        ;
      }
      iVar11 = iVar11 + 1;
    } while (getter.Count != iVar11);
  }
  return;
}

Assistant:

inline void RenderMarkers(Getter getter, Transformer transformer, ImDrawList& DrawList, ImPlotMarker marker, float size, bool rend_mk_line, ImU32 col_mk_line, float weight, bool rend_mk_fill, ImU32 col_mk_fill) {
    static void (*marker_table[ImPlotMarker_COUNT])(ImDrawList&, const ImVec2&, float s, bool, ImU32, bool, ImU32, float) = {
        RenderMarkerCircle,
        RenderMarkerSquare,
        RenderMarkerDiamond ,
        RenderMarkerUp ,
        RenderMarkerDown ,
        RenderMarkerLeft,
        RenderMarkerRight,
        RenderMarkerCross,
        RenderMarkerPlus,
        RenderMarkerAsterisk
    };
    ImPlotContext& gp = *GImPlot;
    for (int i = 0; i < getter.Count; ++i) {
        ImVec2 c = transformer(getter(i));
        if (gp.CurrentPlot->PlotRect.Contains(c))
            marker_table[marker](DrawList, c, size, rend_mk_line, col_mk_line, rend_mk_fill, col_mk_fill, weight);
    }
}